

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::base::LogFormat::LogFormat(LogFormat *this)

{
  Loggable *in_RDI;
  
  Loggable::Loggable(in_RDI);
  in_RDI->_vptr_Loggable = (_func_int **)&PTR__LogFormat_002992a0;
  *(undefined4 *)&in_RDI[1]._vptr_Loggable = 0x3f2;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  std::__cxx11::string::string((string *)(in_RDI + 6));
  std::__cxx11::string::string((string *)(in_RDI + 10));
  *(undefined4 *)&in_RDI[0xe]._vptr_Loggable = 0;
  utils::OS::currentUser_abi_cxx11_();
  utils::OS::currentHost_abi_cxx11_();
  return;
}

Assistant:

LogFormat::LogFormat(void) :
  m_level(Level::Unknown),
  m_userFormat(base::type::string_t()),
  m_format(base::type::string_t()),
  m_dateTimeFormat(std::string()),
  m_flags(0x0),
  m_currentUser(base::utils::OS::currentUser()),
  m_currentHost(base::utils::OS::currentHost()) {
}